

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeXMLProvider::QMimeXMLProvider
          (QMimeXMLProvider *this,QMimeDatabasePrivate *db,InternalDatabaseEnum param_3)

{
  pointer pcVar1;
  QMimeProviderBase *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  qsizetype size;
  char *data;
  unique_ptr<char[],_std::default_delete<char[]>_> uncompressed;
  char *in_stack_ffffffffffffff38;
  QMimeAllGlobPatterns *in_stack_ffffffffffffff40;
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  QMimeDatabasePrivate *in_stack_ffffffffffffff48;
  QHash<QString,_QString> *this_01;
  QHash<QString,_QList<QString>_> *this_02;
  QMimeXMLProvider *this_03;
  unique_ptr<char[],_std::default_delete<char[]>_> local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  internalMimeFileName();
  QMimeProviderBase::QMimeProviderBase
            (in_RSI,in_stack_ffffffffffffff48,(QString *)in_stack_ffffffffffffff40);
  QString::~QString((QString *)0x8fce0d);
  *in_RDI = &PTR__QMimeXMLProvider_00bef128;
  QHash<QString,_QMimeTypeXMLData>::QHash((QHash<QString,_QMimeTypeXMLData> *)(in_RDI + 6));
  this_01 = (QHash<QString,_QString> *)(in_RDI + 7);
  QHash<QString,_QString>::QHash(this_01);
  this_02 = (QHash<QString,_QList<QString>_> *)(in_RDI + 8);
  QHash<QString,_QList<QString>_>::QHash(this_02);
  this_03 = (QMimeXMLProvider *)(in_RDI + 9);
  QMimeAllGlobPatterns::QMimeAllGlobPatterns(in_stack_ffffffffffffff40);
  QList<QMimeMagicRuleMatcher>::QList((QList<QMimeMagicRuleMatcher> *)0x8fce76);
  QList<QString>::QList((QList<QString> *)0x8fce8c);
  local_28[0]._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 &DAT_aaaaaaaaaaaaaaaa;
  operator_new__(0x4a3d4);
  this_00 = local_28;
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>(this_00,in_stack_ffffffffffffff38);
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  ZSTD_decompress(pcVar1,0x4a3d4,mimetype_database,0xa7f3);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  load(this_03,(char *)this_02,(qsizetype)this_01);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMimeXMLProvider::QMimeXMLProvider(QMimeDatabasePrivate *db, InternalDatabaseEnum)
    : QMimeProviderBase(db, internalMimeFileName())
{
    static_assert(sizeof(mimetype_database), "Bundled MIME database is empty");
    static_assert(sizeof(mimetype_database) <= MimeTypeDatabaseOriginalSize,
                      "Compressed MIME database is larger than the original size");
    static_assert(MimeTypeDatabaseOriginalSize <= 16*1024*1024,
                      "Bundled MIME database is too big");
    const char *data = reinterpret_cast<const char *>(mimetype_database);
    qsizetype size = MimeTypeDatabaseOriginalSize;

#ifdef MIME_DATABASE_IS_ZSTD
    // uncompress with libzstd
    std::unique_ptr<char []> uncompressed(new char[size]);
    size = ZSTD_decompress(uncompressed.get(), size, mimetype_database, sizeof(mimetype_database));
    Q_ASSERT(!ZSTD_isError(size));
    data = uncompressed.get();
#elif defined(MIME_DATABASE_IS_GZIP)
    std::unique_ptr<char []> uncompressed(new char[size]);
    z_stream zs = {};
    zs.next_in = const_cast<Bytef *>(mimetype_database);
    zs.avail_in = sizeof(mimetype_database);
    zs.next_out = reinterpret_cast<Bytef *>(uncompressed.get());
    zs.avail_out = size;

    int res = inflateInit2(&zs, MAX_WBITS | 32);
    Q_ASSERT(res == Z_OK);
    res = inflate(&zs, Z_FINISH);
    Q_ASSERT(res == Z_STREAM_END);
    res = inflateEnd(&zs);
    Q_ASSERT(res == Z_OK);

    data = uncompressed.get();
    size = zs.total_out;
#endif

    load(data, size);
}